

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall
QTableWidget::setCurrentItem(QTableWidget *this,QTableWidgetItem *item,SelectionFlags command)

{
  long lVar1;
  long lVar2;
  char *__s;
  long *plVar3;
  long in_FS_OFFSET;
  Data *local_28;
  
  local_28 = *(Data **)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  lVar2 = *(long *)(lVar1 + 800);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = *(long **)(lVar1 + 0x328);
  }
  __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  QTableModel::index((QTableModel *)&stack0xffffffffffffffc0,__s,(int)item);
  (**(code **)(*plVar3 + 0x60))
            (plVar3,(QTableModel *)&stack0xffffffffffffffc0,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setCurrentItem(QTableWidgetItem *item, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableWidget);
    d->selectionModel->setCurrentIndex(d->tableModel()->index(item), command);
}